

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

FString BuildString(int argc,FString *argv)

{
  char *pcVar1;
  FString *pFVar2;
  FString *in_RDX;
  undefined4 in_register_0000003c;
  FString *this;
  FString local_58;
  FString local_50;
  long local_48;
  long quotepos;
  long substr_start;
  int local_28;
  undefined1 local_21;
  int arg;
  FString *argv_local;
  FString *pFStack_10;
  int argc_local;
  FString *buf;
  
  this = (FString *)CONCAT44(in_register_0000003c,argc);
  argv_local._4_4_ = (int)argv;
  pFStack_10 = this;
  if (argv_local._4_4_ == 1) {
    FString::FString(this,in_RDX);
  }
  else {
    local_21 = 0;
    _arg = in_RDX;
    FString::FString(this);
    for (local_28 = 0; local_28 < argv_local._4_4_; local_28 = local_28 + 1) {
      pcVar1 = FString::operator_cast_to_char_(_arg + local_28);
      pcVar1 = strchr(pcVar1,0x22);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = FString::operator_cast_to_char_(_arg + local_28);
        pcVar1 = strchr(pcVar1,0x20);
        if (pcVar1 == (char *)0x0) {
          pFVar2 = FString::operator<<(this,_arg + local_28);
          FString::operator<<(pFVar2,' ');
        }
        else {
          pFVar2 = FString::operator<<(this,'\"');
          pFVar2 = FString::operator<<(pFVar2,_arg + local_28);
          FString::operator<<(pFVar2,"\" ");
        }
      }
      else {
        FString::operator<<(this,'\"');
        quotepos = 0;
        while (local_48 = FString::IndexOf(_arg + local_28,'\"',quotepos), -1 < local_48) {
          if (quotepos < local_48) {
            FString::Mid(&local_50,(size_t)(_arg + local_28),quotepos);
            FString::operator<<(this,&local_50);
            FString::~FString(&local_50);
          }
          FString::operator<<(this,"\\\"");
          quotepos = local_48 + 1;
        }
        FString::Mid(&local_58,(size_t)(_arg + local_28),quotepos);
        pFVar2 = FString::operator<<(this,&local_58);
        FString::operator<<(pFVar2,"\" ");
        FString::~FString(&local_58);
      }
    }
  }
  return (FString)(char *)this;
}

Assistant:

FString BuildString (int argc, FString *argv)
{
	if (argc == 1)
	{
		return *argv;
	}
	else
	{
		FString buf;
		int arg;

		for (arg = 0; arg < argc; arg++)
		{
			if (strchr(argv[arg], '"'))
			{ // If it contains one or more quotes, we need to escape them.
				buf << '"';
				long substr_start = 0, quotepos;
				while ((quotepos = argv[arg].IndexOf('"', substr_start)) >= 0)
				{
					if (substr_start < quotepos)
					{
						buf << argv[arg].Mid(substr_start, quotepos - substr_start);
					}
					buf << "\\\"";
					substr_start = quotepos + 1;
				}
				buf << argv[arg].Mid(substr_start) << "\" ";
			}
			else if (strchr(argv[arg], ' '))
			{ // If it contains a space, it needs to be quoted.
				buf << '"' << argv[arg] << "\" ";
			}
			else
			{
				buf << argv[arg] << ' ';
			}
		}
		return buf;
	}
}